

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall cfd::core::DescriptorNode::CheckChecksum(DescriptorNode *this,string *descriptor)

{
  bool bVar1;
  long lVar2;
  undefined8 uVar3;
  ulong uVar4;
  string *in_stack_fffffffffffffed0;
  string *message;
  undefined8 in_stack_fffffffffffffed8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffee0;
  CfdException *this_00;
  allocator local_109;
  string local_108 [32];
  CfdSourceLocation local_e8;
  undefined1 local_ca;
  undefined1 local_c9 [33];
  CfdSourceLocation local_a8;
  undefined1 local_90 [8];
  string checksum;
  undefined1 local_59 [33];
  unsigned_long local_38;
  CfdSourceLocation local_30;
  string *local_18;
  string *descriptor_local;
  DescriptorNode *this_local;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  local_18 = descriptor;
  descriptor_local = &this->name_;
  lVar2 = ::std::__cxx11::string::size();
  if (lVar2 != 8) {
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0x3f8;
    local_30.funcname = "CheckChecksum";
    local_38 = ::std::__cxx11::string::size();
    logger::warn<unsigned_long>
              (&local_30,"Expected 8 character checksum, not {} characters.",&local_38);
    checksum.field_2._M_local_buf[0xb] = '\x01';
    uVar3 = __cxa_allocate_exception(0x30);
    this_00 = (CfdException *)local_59;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(local_59 + 1),"Expected 8 character checksum.",(allocator *)this_00);
    CfdException::CfdException(this_00,(CfdError)((ulong)uVar3 >> 0x20),in_stack_fffffffffffffed0);
    checksum.field_2._M_local_buf[0xb] = '\0';
    __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  GenerateChecksum((string *)local_90,local_18);
  uVar4 = ::std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    bVar1 = ::std::operator!=(&this->checksum_,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90);
    if (!bVar1) {
      ::std::__cxx11::string::~string((string *)local_90);
      return;
    }
    local_e8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                 ,0x2f);
    local_e8.filename = local_e8.filename + 1;
    local_e8.line = 0x405;
    local_e8.funcname = "CheckChecksum";
    logger::warn<std::__cxx11::string&,std::__cxx11::string&>
              (&local_e8,"Provided checksum \'{}\' does not match computed checksum \'{}\'.",
               &this->checksum_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    uVar3 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_108,"Unmatch checksum.",&local_109);
    CfdException::CfdException(in_stack_fffffffffffffee0,error_code,in_stack_fffffffffffffed0);
    __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_a8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
               ,0x2f);
  local_a8.filename = local_a8.filename + 1;
  local_a8.line = 0x3ff;
  local_a8.funcname = "CheckChecksum";
  logger::warn<>(&local_a8,"Invalid characters in payload.");
  local_ca = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  message = (string *)local_c9;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)(local_c9 + 1),"Invalid characters in payload.",(allocator *)message);
  CfdException::CfdException(in_stack_fffffffffffffee0,error_code,message);
  local_ca = 0;
  __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void DescriptorNode::CheckChecksum(const std::string& descriptor) {
  if (checksum_.size() != 8) {
    warn(
        CFD_LOG_SOURCE, "Expected 8 character checksum, not {} characters.",
        checksum_.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Expected 8 character checksum.");
  }
  std::string checksum = GenerateChecksum(descriptor);
  if (checksum.empty()) {
    warn(CFD_LOG_SOURCE, "Invalid characters in payload.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid characters in payload.");
  }
  if (checksum_ != checksum) {
    warn(
        CFD_LOG_SOURCE,
        "Provided checksum '{}' does not match computed checksum '{}'.",
        checksum_, checksum);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unmatch checksum.");
  }
}